

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  AppConfig config;
  int iVar1;
  ostream *poVar2;
  SceneInfo *sceneInfo;
  Application *renderer;
  long lVar3;
  Viewer viewer;
  HDRImageBuffer *local_508;
  long local_500;
  long local_4f8;
  long local_4f0;
  string sceneFilePath;
  Application app;
  
  local_4f8 = 4;
  lVar3 = 1;
  local_508 = (HDRImageBuffer *)0x0;
  local_500 = 1;
  local_4f0 = 1;
  do {
    iVar1 = getopt(argc,argv,"s:l:t:m:e:h");
    switch(iVar1) {
    case 0x6c:
      iVar1 = atoi(optarg);
      local_4f8 = (long)iVar1;
      break;
    case 0x6d:
      iVar1 = atoi(optarg);
      local_500 = (long)iVar1;
      break;
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
switchD_001a4066_caseD_6e:
      usage(*argv);
      return 1;
    case 0x73:
      iVar1 = atoi(optarg);
      lVar3 = (long)iVar1;
      break;
    case 0x74:
      iVar1 = atoi(optarg);
      local_4f0 = (long)iVar1;
      break;
    default:
      if (iVar1 == -1) {
        if (optind < argc) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sceneFilePath,argv[optind],(allocator<char> *)&app);
          poVar2 = std::operator<<((ostream *)&std::cerr,"[Scotty3D] ");
          poVar2 = std::operator<<(poVar2,"Input scene file: ");
          poVar2 = std::operator<<(poVar2,(string *)&sceneFilePath);
          std::endl<char,std::char_traits<char>>(poVar2);
          sceneInfo = (SceneInfo *)operator_new(0x18);
          (sceneInfo->nodes).
          super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (sceneInfo->nodes).
          super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (sceneInfo->nodes).
          super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          iVar1 = CMU462::Collada::ColladaParser::load(sceneFilePath._M_dataplus._M_p,sceneInfo);
          if (iVar1 < 0) {
            poVar2 = std::operator<<((ostream *)&std::cerr,"[Scotty3D] ");
            poVar2 = std::operator<<(poVar2,"Error: parsing failed!");
            std::endl<char,std::char_traits<char>>(poVar2);
            CMU462::Collada::SceneInfo::~SceneInfo(sceneInfo);
            operator_delete(sceneInfo,0x18);
          }
          else {
            CMU462::Viewer::Viewer(&viewer);
            config.pathtracer_max_ray_depth = local_500;
            config.pathtracer_ns_aa = lVar3;
            config.pathtracer_ns_area_light = local_4f8;
            config.pathtracer_ns_diff = 1;
            config.pathtracer_ns_glsy = 1;
            config.pathtracer_ns_refr = 1;
            config.pathtracer_num_threads = local_4f0;
            config.pathtracer_envmap = local_508;
            CMU462::Application::Application(&app,config);
            renderer = &app;
            CMU462::Viewer::set_renderer(&viewer,&renderer->super_Renderer);
            CMU462::Viewer::init(&viewer,(EVP_PKEY_CTX *)renderer);
            CMU462::Application::load(&app,sceneInfo);
            std::vector<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>::~vector
                      ((vector<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_> *)
                       sceneInfo);
            operator_delete(sceneInfo,0x18);
            CMU462::Viewer::start(&viewer);
          }
          exit(0);
        }
        goto switchD_001a4066_caseD_6e;
      }
      if (iVar1 != 0x65) goto switchD_001a4066_caseD_6e;
      local_508 = load_exr(optarg);
    }
  } while( true );
}

Assistant:

int main( int argc, char** argv ) {

  // get the options
  AppConfig config; int opt;
  while ( (opt = getopt(argc, argv, "s:l:t:m:e:h")) != -1 ) {  // for each option...
    switch ( opt ) {
      case 's':
        config.pathtracer_ns_aa = atoi(optarg);
        break;
      case 'l':
        config.pathtracer_ns_area_light = atoi(optarg);
        break;
      case 't':
        config.pathtracer_num_threads = atoi(optarg);
        break;
      case 'm':
        config.pathtracer_max_ray_depth = atoi(optarg);
        break;
      case 'e':
        config.pathtracer_envmap = load_exr(optarg);
        break;
      default:
        usage(argv[0]);
        return 1;
    }
  }

  // print usage if no argument given
  if (optind >= argc) {
    usage(argv[0]);
    return 1;
  }

  string sceneFilePath = argv[optind];
  msg("Input scene file: " << sceneFilePath);

  // parse scene
  Collada::SceneInfo *sceneInfo = new Collada::SceneInfo();
  if (Collada::ColladaParser::load(sceneFilePath.c_str(), sceneInfo) < 0)
  {
    msg( "Error: parsing failed!" );
    delete sceneInfo;
    exit(0);
  }

  // create viewer
  Viewer viewer = Viewer();

  // create application
  Application app (config);

  // set renderer
  viewer.set_renderer(&app);

  // init viewer
  viewer.init();

  // load scene
  app.load(sceneInfo);


  delete sceneInfo;

  // NOTE (sky): are we copying everything to dynamic scene? If so:
  // TODO (sky): check and make sure the destructor is freeing everything

  // start viewer
  viewer.start();

  // TODO:
  // apparently the meshEdit renderer instance was not destroyed properly
  // not sure if this is due to the recent refactor but if anyone got some
  // free time, check the destructor for Application.
  exit(EXIT_SUCCESS); // shamelessly faking it

  return 0;

}